

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

void __thiscall
cmCTestRunTest::WriteLogOutputTop(cmCTestRunTest *this,size_t completed,size_t total)

{
  uint uVar1;
  cmCTest *pcVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  pointer pbVar6;
  string outname;
  char *local_340 [4];
  ostringstream cmCTestLog_msg_6;
  long alStack_310 [45];
  ostringstream indexStr;
  long alStack_198 [45];
  
  lVar5 = 3;
  if (total < 100) {
    lVar5 = 2 - (ulong)(total < 10);
  }
  if (this->NumberOfRunsLeft == 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
    *(long *)((long)alStack_198 + *(long *)(_indexStr + -0x18)) = lVar5;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&indexStr);
    std::operator<<(poVar4,"/");
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2eb,_cmCTestLog_msg_6,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_6);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
    *(long *)((long)alStack_198 + *(long *)(_indexStr + -0x18)) = lVar5;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&indexStr);
    std::operator<<(poVar4," ");
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2ed,_cmCTestLog_msg_6,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
    *(long *)((long)alStack_198 + *(long *)(_indexStr + -0x18)) = lVar5;
    poVar4 = std::operator<<((ostream *)&indexStr," ");
    std::operator<<(poVar4," ");
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2f4,_cmCTestLog_msg_6,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_6);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
    *(long *)((long)alStack_198 + *(long *)(_indexStr + -0x18)) = lVar5;
    poVar4 = std::operator<<((ostream *)&indexStr," ");
    std::operator<<(poVar4," ");
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2f6,_cmCTestLog_msg_6,false);
  }
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_6);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
  if (this->TestHandler->MemCheck == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
    std::operator<<((ostream *)&indexStr,"MemCheck");
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2fb,_cmCTestLog_msg_6,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
    std::operator<<((ostream *)&indexStr,"Test");
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2ff,_cmCTestLog_msg_6,false);
  }
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_6);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
  poVar4 = std::operator<<((ostream *)&indexStr," #");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->Index);
  std::operator<<(poVar4,":");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_6);
  uVar1 = this->TestHandler->MaxIndex;
  lVar5 = 6;
  if (uVar1 < 100) {
    lVar5 = 5 - (ulong)(uVar1 < 10);
  }
  *(long *)((long)alStack_310 + *(long *)(_cmCTestLog_msg_6 + -0x18)) = lVar5;
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&cmCTestLog_msg_6,(string *)&outname);
  std::__cxx11::string::~string((string *)&outname);
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x306,outname._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&outname);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_6);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_6);
  std::operator<<((ostream *)&cmCTestLog_msg_6," ");
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x307,outname._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&outname);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_6);
  iVar3 = cmCTest::GetMaxTestNameWidth(this->CTest);
  std::operator+(&outname,&this->TestProperties->Name," ");
  std::__cxx11::string::resize((ulong)&outname,(char)iVar3 + '\x04');
  poVar4 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar4 = std::operator<<(poVar4,"/");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," Testing: ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar4 = std::operator<<(poVar4,"/");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," Test: ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(this->TestHandler->LogFile,"Command: \"");
  poVar4 = std::operator<<(poVar4,(string *)&this->ActualCommand);
  std::operator<<(poVar4,"\"");
  for (pbVar6 = (this->Arguments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; poVar4 = this->TestHandler->LogFile,
      pbVar6 != (this->Arguments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    poVar4 = std::operator<<(poVar4," \"");
    poVar4 = std::operator<<(poVar4,(string *)pbVar6);
    std::operator<<(poVar4,"\"");
  }
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"Directory: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->TestProperties->Directory);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  poVar4 = std::operator<<(poVar4,"\" start time: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->StartTime);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(this->TestHandler->LogFile,"Output:");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"----------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(this->TestHandler->LogFile,(string *)&this->ProcessOutput);
  poVar4 = std::operator<<(poVar4,"<end of output>");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_6);
  std::operator<<((ostream *)&cmCTestLog_msg_6,outname._M_dataplus._M_p);
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x326,local_340[0],false);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_6);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_6);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg_6,"Testing ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::operator<<(poVar4," ... ");
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x328,local_340[0],false);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_6);
  std::__cxx11::string::~string((string *)&outname);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
  return;
}

Assistant:

void cmCTestRunTest::WriteLogOutputTop(size_t completed, size_t total)
{
  // if this is the last or only run of this test
  // then print out completed / total
  // Only issue is if a test fails and we are running until fail
  // then it will never print out the completed / total, same would
  // got for run until pass.  Trick is when this is called we don't
  // yet know if we are passing or failing.
  if(this->NumberOfRunsLeft == 1)
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
               << completed << "/");
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
               << total << " ");
    }
  // if this is one of several runs of a test just print blank space
  // to keep things neat
  else
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
               << " " << " ");
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
               << " " << " ");
    }

  if ( this->TestHandler->MemCheck )
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "MemCheck");
    }
  else
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "Test");
    }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
             << indexStr.str());
  cmCTestLog(this->CTest, HANDLER_OUTPUT, " ");
  const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
  std::string outname = this->TestProperties->Name + " ";
  outname.resize(maxTestNameWidth + 4, '.');

  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
    << this->TestHandler->TotalNumberOfTests << " Testing: "
    << this->TestProperties->Name << std::endl;
  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
    << this->TestHandler->TotalNumberOfTests
    << " Test: " << this->TestProperties->Name << std::endl;
  *this->TestHandler->LogFile << "Command: \"" << this->ActualCommand << "\"";

  for (std::vector<std::string>::iterator i = this->Arguments.begin();
       i != this->Arguments.end(); ++i)
    {
    *this->TestHandler->LogFile
      << " \"" << *i << "\"";
    }
  *this->TestHandler->LogFile << std::endl
    << "Directory: " << this->TestProperties->Directory << std::endl
    << "\"" << this->TestProperties->Name << "\" start time: "
    << this->StartTime << std::endl;

  *this->TestHandler->LogFile
    << "Output:" << std::endl
    << "----------------------------------------------------------"
    << std::endl;
  *this->TestHandler->LogFile
    << this->ProcessOutput << "<end of output>" << std::endl;

  cmCTestLog(this->CTest, HANDLER_OUTPUT, outname.c_str());
  cmCTestLog(this->CTest, DEBUG, "Testing "
             << this->TestProperties->Name << " ... ");
}